

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry_bp.c
# Opt level: O2

void SetInitialProfiles(N_Vector u,sunrealtype dx,sunrealtype dy)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  pdVar1 = (double *)N_VGetArrayPointer();
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    dVar5 = ((double)(int)lVar2 * dy + 30.0 + -40.0) * 0.1;
    dVar5 = dVar5 * dVar5;
    dVar5 = dVar5 * dVar5 * 0.5 + (1.0 - dVar5);
    pdVar3 = pdVar1;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      dVar6 = ((double)(int)lVar4 * dx + 0.0 + -10.0) * 0.1;
      dVar6 = dVar6 * dVar6;
      dVar6 = dVar6 * dVar6 * 0.5 + (1.0 - dVar6);
      *pdVar3 = dVar6 * 1000000.0 * dVar5;
      pdVar3[1] = dVar6 * 1000000000000.0 * dVar5;
      pdVar3 = pdVar3 + 2;
    }
    pdVar1 = pdVar1 + 0x14;
  }
  return;
}

Assistant:

static void SetInitialProfiles(N_Vector u, sunrealtype dx, sunrealtype dy)
{
  int jx, jy;
  sunrealtype x, y, cx, cy;
  sunrealtype* udata;

  /* Set pointer to data array in vector u. */

  udata = N_VGetArrayPointer(u);

  /* Load initial profiles of c1 and c2 into u vector */

  for (jy = 0; jy < MY; jy++)
  {
    y  = YMIN + jy * dy;
    cy = SQR(SUN_RCONST(0.1) * (y - YMID));
    cy = ONE - cy + SUN_RCONST(0.5) * SQR(cy);
    for (jx = 0; jx < MX; jx++)
    {
      x                       = XMIN + jx * dx;
      cx                      = SQR(SUN_RCONST(0.1) * (x - XMID));
      cx                      = ONE - cx + SUN_RCONST(0.5) * SQR(cx);
      IJKth(udata, 1, jx, jy) = C1_SCALE * cx * cy;
      IJKth(udata, 2, jx, jy) = C2_SCALE * cx * cy;
    }
  }
}